

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmaster.c
# Opt level: O0

boolean use_merged_upsample(j_decompress_ptr cinfo)

{
  j_decompress_ptr cinfo_local;
  
  if ((cinfo->do_fancy_upsampling == 0) && (cinfo->CCIR601_sampling == 0)) {
    if ((cinfo->jpeg_color_space == JCS_YCbCr) &&
       (((cinfo->num_components == 3 && (cinfo->out_color_space == JCS_RGB)) &&
        (cinfo->out_color_components == 3)))) {
      if (((((cinfo->comp_info->h_samp_factor == 2) && (cinfo->comp_info[1].h_samp_factor == 1)) &&
           (cinfo->comp_info[2].h_samp_factor == 1)) &&
          ((cinfo->comp_info->v_samp_factor < 3 && (cinfo->comp_info[1].v_samp_factor == 1)))) &&
         (cinfo->comp_info[2].v_samp_factor == 1)) {
        if (((((cinfo->comp_info->DCT_h_scaled_size == cinfo->min_DCT_h_scaled_size) &&
              (cinfo->comp_info[1].DCT_h_scaled_size == cinfo->min_DCT_h_scaled_size)) &&
             (cinfo->comp_info[2].DCT_h_scaled_size == cinfo->min_DCT_h_scaled_size)) &&
            ((cinfo->comp_info->DCT_v_scaled_size == cinfo->min_DCT_v_scaled_size &&
             (cinfo->comp_info[1].DCT_v_scaled_size == cinfo->min_DCT_v_scaled_size)))) &&
           (cinfo->comp_info[2].DCT_v_scaled_size == cinfo->min_DCT_v_scaled_size)) {
          cinfo_local._4_4_ = 1;
        }
        else {
          cinfo_local._4_4_ = 0;
        }
      }
      else {
        cinfo_local._4_4_ = 0;
      }
    }
    else {
      cinfo_local._4_4_ = 0;
    }
  }
  else {
    cinfo_local._4_4_ = 0;
  }
  return cinfo_local._4_4_;
}

Assistant:

LOCAL(boolean)
use_merged_upsample (j_decompress_ptr cinfo)
{
#ifdef UPSAMPLE_MERGING_SUPPORTED
  /* Merging is the equivalent of plain box-filter upsampling */
  if (cinfo->do_fancy_upsampling || cinfo->CCIR601_sampling)
    return FALSE;
  /* jdmerge.c only supports YCC=>RGB color conversion */
  if (cinfo->jpeg_color_space != JCS_YCbCr || cinfo->num_components != 3 ||
      cinfo->out_color_space != JCS_RGB ||
      cinfo->out_color_components != RGB_PIXELSIZE)
    return FALSE;
  /* and it only handles 2h1v or 2h2v sampling ratios */
  if (cinfo->comp_info[0].h_samp_factor != 2 ||
      cinfo->comp_info[1].h_samp_factor != 1 ||
      cinfo->comp_info[2].h_samp_factor != 1 ||
      cinfo->comp_info[0].v_samp_factor >  2 ||
      cinfo->comp_info[1].v_samp_factor != 1 ||
      cinfo->comp_info[2].v_samp_factor != 1)
    return FALSE;
  /* furthermore, it doesn't work if we've scaled the IDCTs differently */
  if (cinfo->comp_info[0].DCT_h_scaled_size != cinfo->min_DCT_h_scaled_size ||
      cinfo->comp_info[1].DCT_h_scaled_size != cinfo->min_DCT_h_scaled_size ||
      cinfo->comp_info[2].DCT_h_scaled_size != cinfo->min_DCT_h_scaled_size ||
      cinfo->comp_info[0].DCT_v_scaled_size != cinfo->min_DCT_v_scaled_size ||
      cinfo->comp_info[1].DCT_v_scaled_size != cinfo->min_DCT_v_scaled_size ||
      cinfo->comp_info[2].DCT_v_scaled_size != cinfo->min_DCT_v_scaled_size)
    return FALSE;
  /* ??? also need to test for upsample-time rescaling, when & if supported */
  return TRUE;			/* by golly, it'll work... */
#else
  return FALSE;
#endif
}